

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O1

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ProceedQCWithTraits
          (Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,QuadAndLinTerms *body,int sens,double rhs,QPTermsTraits *qptt)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  size_ty sVar4;
  bool bVar5;
  byte bVar6;
  int iSame1;
  uint uVar7;
  LinTerms *lint;
  QuadTerms *qpterms;
  double dVar8;
  
  qpterms = &body->super_QuadTerms;
  uVar7 = qptt->nDiffVars;
  if ((uVar7 == 0) &&
     ((body->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0)) {
    dVar8 = (double)sens * rhs;
    iVar2 = qptt->nSamePos;
    if ((((iVar2 == 1 && 0 < sens) && 0.0 <= dVar8) &&
        (iSame1 = qptt->iSamePos,
        0.0 <= (((this->
                 super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).mc_)->
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(qpterms->folded_).
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr[iSame1].first.first])) ||
       ((iVar3 = qptt->nSameNeg, (iVar3 == 1 && sens < 0) && 0.0 <= dVar8 &&
        (iSame1 = qptt->iSameNeg,
        0.0 <= (((this->
                 super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).mc_)->
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(qpterms->folded_).
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr[iSame1].first.first])))) {
      bVar5 = AddStandardQC(this,qpterms,iSame1,0.0,rhs);
      return bVar5;
    }
    if (((iVar3 != 0 && (iVar2 == 0 && 0 < sens)) && dVar8 <= 0.0) ||
       (((sens < 0 && iVar3 == 0) && iVar2 != 0) && dVar8 <= 0.0)) {
      bVar5 = AddStandardQC(this,qpterms,-1,rhs,0.0);
      return bVar5;
    }
  }
  else {
    sVar4 = (body->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
            .super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    bVar5 = true;
    if (((uVar7 == 1) != (sVar4 == 1)) && (dVar8 = (double)sens, 0.0 <= dVar8 * rhs)) {
      if (((sVar4 == 1) &&
          ((pdVar1 = (((this->
                       super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       ).mc_)->
                     super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     *(body->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.
                      m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
           *pdVar1 <= 0.0 && *pdVar1 != 0.0 ||
           (*(body->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.
             m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr * dVar8 < 0.0))
          )) || ((uVar7 == 1 && (dVar8 * qptt->coef12 < 0.0)))) {
        uVar7 = 0;
      }
      else {
        if (((sens < 1) || (qptt->nSamePos != 0)) && ((-1 < sens || (qptt->nSameNeg != 0))))
        goto LAB_00420dbf;
        bVar5 = AddRotatedQC(this,qpterms,&body->super_LinTerms,rhs,qptt->iDiffVars);
        uVar7 = (uint)bVar5;
      }
      bVar5 = false;
    }
LAB_00420dbf:
    bVar6 = (byte)uVar7;
    if (!bVar5) goto LAB_00420dc7;
  }
  bVar6 = 0;
LAB_00420dc7:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ProceedQCWithTraits(const QuadAndLinTerms& body,
                           int sens, double rhs,
                           const QPTermsTraits& qptt) {
    const auto& lint = body.GetLinTerms();
    assert(lint.size() <= 1);
    assert(qptt.nDiffVars <= 1);
    const auto& qpterms = body.GetQPTerms();
    if (qptt.nDiffVars || lint.size()) {       // Rotated cone?
      const auto fLT1 = lint.size()==1;        // Constant in the lhs?
      const auto fND1 = qptt.nDiffVars==1;
      if (fLT1 + fND1 == 1 &&
          rhs * sens >= 0.0) {                 // ... >= ... + rhs
        if (fLT1 &&                            // Check lin term
            (MC().lb( lint.var(0) ) < 0.0 ||
             lint.coef(0)*sens < 0.0))
          return false;
        if (fND1 && qptt.coef12*sens<0.0)
          return false;
        if ((sens>0 &&
             qptt.nSamePos==0)
            ||
            (sens<0 &&
             qptt.nSameNeg==0))
          return AddRotatedQC(qpterms, lint, rhs,
                              qptt.iDiffVars);
      }
    } else {                          // Standard cone?
      if (0.0 <= rhs*sens &&          // It's x^2 >= ||y^2|| + |rhs|
          sens>0 && qptt.nSamePos==1 &&
          MC().lb(qpterms.var1(qptt.iSamePos))>=0.0)
        return AddStandardQC(qpterms, qptt.iSamePos, 0.0, rhs);
      if (0.0 <= rhs*sens &&
          sens<0 && qptt.nSameNeg==1 &&
          MC().lb(qpterms.var1(qptt.iSameNeg))>=0.0)
        return AddStandardQC(qpterms, qptt.iSameNeg, 0.0, rhs);
      if (0.0 >= rhs*sens &&          // |rhs| >= ||y^2||
          sens>0 && qptt.nSamePos==0 && qptt.nSameNeg)
        return AddStandardQC(qpterms, -1, rhs);
      if (0.0 >= rhs*sens &&
          sens<0 && qptt.nSameNeg==0 && qptt.nSamePos)
        return AddStandardQC(qpterms, -1, rhs);
    }
    return false;
  }